

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * __thiscall
Corrade::Utility::String::Implementation::join
          (string *__return_storage_ptr__,Implementation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strings,ArrayView<const_char> delimiter)

{
  BasicStringView<const_char> *pBVar1;
  long lVar2;
  size_t i;
  unsigned_long i_00;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  stringViews;
  ArrayView<const_char> local_a8;
  String local_98;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  local_80;
  StringIterable local_68;
  BasicStringView<const_char> local_40;
  
  local_a8._size = (size_t)delimiter._data;
  local_a8._data = (char *)strings;
  Containers::
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  ::Array(&local_80,*(long *)(this + 8) - *(long *)this >> 5,strings,local_a8._size,delimiter._size)
  ;
  lVar2 = 0;
  for (i_00 = 0; i_00 != *(long *)(this + 8) - *(long *)this >> 5; i_00 = i_00 + 1) {
    Containers::BasicStringView<char_const>::
    BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
              ((BasicStringView<char_const> *)&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)this + lVar2));
    pBVar1 = Containers::
             Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
             ::operator[]<unsigned_long,_0>(&local_80,i_00);
    pBVar1->_data = (char *)local_68._data;
    pBVar1->_sizePlusFlags = (size_t)local_68._context;
    lVar2 = lVar2 + 0x20;
  }
  Containers::BasicStringView<char_const>::
  BasicStringView<Corrade::Containers::ArrayView<char_const>const&,Corrade::Containers::ArrayView<char_const>>
            ((BasicStringView<char_const> *)&local_40,&local_a8,(StringViewFlags)0x0);
  Containers::StringIterable::
  StringIterable<Corrade::Containers::Array<Corrade::Containers::BasicStringView<char_const>,void(*)(Corrade::Containers::BasicStringView<char_const>*,unsigned_long)>&,Corrade::Containers::StringIterable>
            (&local_68,&local_80);
  Containers::BasicStringView<const_char>::join(&local_98,&local_40,&local_68);
  Containers::Implementation::
  StringConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::to(__return_storage_ptr__,&local_98);
  Containers::String::~String(&local_98);
  Containers::
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  ::~Array(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const std::vector<std::string>& strings, const Containers::ArrayView<const char> delimiter) {
    /* IDGAF that this has two extra allocations due to the Array being created
       and then the String converted to a std::string vector, the input
       std::string instances are MUCH worse */
    Containers::Array<Containers::StringView> stringViews{strings.size()};
    for(std::size_t i = 0; i != strings.size(); ++i)
        stringViews[i] = strings[i];
    return Containers::StringView{delimiter}.join(stringViews);
}